

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

string * set_xterm256_foreground_abi_cxx11_(string *__return_storage_ptr__,int r,int g,int b)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  int iVar6;
  ostringstream oss;
  ostringstream aoStack_198 [112];
  ios_base local_128 [264];
  
  iVar2 = (int)((double)b * 0.114 + (double)r * 0.299 + (double)g * 0.587 + 0.5);
  iVar6 = 0x17;
  if (iVar2 < 0xef) {
    iVar6 = (iVar2 + -3) / 10;
  }
  uVar3 = 1;
  if (0x72 < r) {
    uVar3 = (r - 0x23U) / 0x28;
  }
  iVar2 = iVar6 * 10 + 8;
  uVar5 = 0;
  if ((0x2f < g) && (uVar5 = 1, 0x72 < g)) {
    uVar5 = (ulong)(g - 0x23) / 0x28;
  }
  uVar1 = (0x72 < b) + 1;
  if (b < 0x30) {
    uVar1 = 0;
  }
  if ((uint)((iVar2 - b) * (iVar2 - b) + (iVar2 - g) * (iVar2 - g) + (iVar2 - r) * (iVar2 - r)) <
      ((uint)(byte)(&DAT_0017d4a8)[uVar1] - b) * ((uint)(byte)(&DAT_0017d4a8)[uVar1] - b) +
      ((uint)(byte)(&DAT_0017d4a8)[uVar5] - g) * ((uint)(byte)(&DAT_0017d4a8)[uVar5] - g) +
      ((uint)(byte)(&DAT_0017d4a8)[uVar3] - r) * ((uint)(byte)(&DAT_0017d4a8)[uVar3] - r)) {
    iVar6 = iVar6 + 0xe8;
  }
  else {
    iVar6 = (uVar3 * 0x24 | uVar1) + (int)uVar5 * 6 + 0x10;
  }
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_198,"\x1b[38;5;",7);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)aoStack_198,iVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"m",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

static std::string set_xterm256_foreground(int r, int g, int b) {
    int x = rgb2xterm256(r, g, b);
    std::ostringstream oss;
    oss << "\033[38;5;" << x << "m";
    return oss.str();
}